

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::EvaluateErrorT<std::complex<double>>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra> *this,TPZVec<double> *errors,
          bool store_errors)

{
  TPZVec<double> *pTVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  TPZIntPoints *pTVar6;
  TPZGeoEl *pTVar7;
  bool *pbVar8;
  double *pdVar9;
  TPZCompMesh *pTVar10;
  TPZFMatrix<double> *pTVar11;
  undefined7 in_register_00000011;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  uint uVar18;
  double dVar19;
  int maxIntOrder;
  TPZAutoPointer<TPZIntPoints> intrule;
  REAL weight;
  REAL detJac;
  TPZManVector<int,_3> prevorder;
  TPZManVector<int,_3> maxorder;
  TPZManVector<double,_10> values;
  TPZManVector<double,_10> intpoint;
  TPZFNMatrix<9,_double> jacInv;
  TPZFNMatrix<9,_double> axe;
  TPZFNMatrix<9,_double> jac;
  TPZManVector<double,_10> u_exact;
  TPZManVector<TPZTransform<double>,_10> trvec;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5> datavec;
  int iStack_35f8c;
  TPZAutoPointer<TPZIntPoints> TStack_35f88;
  double dStack_35f80;
  uint uStack_35f74;
  long lStack_35f70;
  TPZVec<double> *pTStack_35f68;
  double dStack_35f60;
  undefined4 uStack_35f54;
  long *plStack_35f50;
  double dStack_35f48;
  TPZManVector<int,_3> TStack_35f40;
  TPZManVector<int,_3> TStack_35f10;
  TPZManVector<double,_10> TStack_35ee0;
  TPZFMatrix<double> TStack_35e70;
  double adStack_35de0 [4];
  TPZManVector<double,_10> TStack_35dc0;
  TPZFMatrix<double> TStack_35d50;
  double adStack_35cc0 [10];
  TPZFMatrix<double> TStack_35c70;
  double adStack_35be0 [10];
  TPZFMatrix<double> TStack_35b90;
  double adStack_35b00 [10];
  TPZManVector<double,_10> TStack_35ab0;
  TPZManVector<TPZTransform<double>,_10> TStack_35a40;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5> TStack_349e0;
  
  TPZVec<double>::Fill(errors,(double *)&TStack_349e0,0,-1);
  lVar4 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))(this)
  ;
  if ((lVar4 != 0) &&
     (lVar4 = __dynamic_cast(lVar4,&TPZMaterial::typeinfo,
                             &TPZNullMaterialCS<std::complex<double>>::typeinfo,0), lVar4 != 0)) {
    return;
  }
  lVar4 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))(this)
  ;
  if ((lVar4 == 0) ||
     (lVar4 = __dynamic_cast(lVar4,&TPZMaterial::typeinfo,
                             &TPZMatCombinedSpacesT<std::complex<double>>::typeinfo,
                             0xfffffffffffffffe), lVar4 == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::EvaluateErrorT(TPZVec<REAL> &, bool) [TGeometry = pzgeom::TPZGeoTetrahedra, TVar = std::complex<double>]"
               ,0x9e);
    pcVar17 = " no material for this element\n";
  }
  else {
    plStack_35f50 =
         (long *)__dynamic_cast(lVar4,&TPZMatCombinedSpacesT<std::complex<double>>::typeinfo,
                                &TPZMatErrorCombinedSpaces<std::complex<double>>::typeinfo,
                                0xfffffffffffffffe);
    if (plStack_35f50 != (long *)0x0) {
      iVar2 = (*(code *)**(undefined8 **)((long)plStack_35f50 + *(long *)(*plStack_35f50 + -0x18)))
                        ((long)plStack_35f50 + *(long *)(*plStack_35f50 + -0x18));
      dStack_35f80 = (double)CONCAT44(dStack_35f80._4_4_,iVar2);
      (*errors->_vptr_TPZVec[3])(errors,(long)iVar2);
      TPZVec<double>::Fill(errors,(double *)&TStack_349e0,0,-1);
      iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))
                        (this);
      if (iVar3 == 0) {
        return;
      }
      uStack_35f54 = (undefined4)CONCAT71(in_register_00000011,store_errors);
      iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb0))
                        (this);
      plVar5 = (long *)(**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl +
                                   0x2d8))(this);
      pTVar6 = (TPZIntPoints *)(**(code **)(*plVar5 + 0x48))(plVar5);
      TStack_35f88.fRef = (TPZReference *)operator_new(0x10);
      ((TStack_35f88.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
      (TStack_35f88.fRef)->fPointer = pTVar6;
      LOCK();
      ((TStack_35f88.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
      UNLOCK();
      iStack_35f8c = (*pTVar6->_vptr_TPZIntPoints[7])(pTVar6);
      lVar4 = (long)iVar3;
      TPZManVector<int,_3>::TPZManVector(&TStack_35f40,lVar4);
      TPZManVector<int,_3>::TPZManVector(&TStack_35f10,lVar4,&iStack_35f8c);
      (*(TStack_35f88.fRef)->fPointer->_vptr_TPZIntPoints[6])
                ((TStack_35f88.fRef)->fPointer,&TStack_35f40);
      if ((0xf < iStack_35f8c) &&
         (iStack_35f8c = *TStack_35f40.super_TPZVec<int>.fStore, iStack_35f8c < 0x10)) {
        iStack_35f8c = 0xf;
      }
      (*(TStack_35f88.fRef)->fPointer->_vptr_TPZIntPoints[5])
                ((TStack_35f88.fRef)->fPointer,&TStack_35f10,0);
      plVar5 = (long *)(**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl +
                                   0xb8))(this);
      iVar3 = (**(code **)(*plVar5 + 0x78))(plVar5);
      lVar14 = (long)iVar3;
      TPZManVector<double,_10>::TPZManVector(&TStack_35ab0,lVar14);
      TStack_35e70.fElem = adStack_35de0;
      TStack_35e70.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      TStack_35e70.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      TStack_35e70.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018454a8;
      TStack_35e70.fSize = 3;
      lStack_35f70 = (long)iVar2;
      TStack_35e70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar4;
      TStack_35e70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar14;
      TStack_35e70.fGiven = TStack_35e70.fElem;
      TPZVec<int>::TPZVec(&TStack_35e70.fPivot.super_TPZVec<int>,0);
      TStack_35e70.fPivot.super_TPZVec<int>.fStore = TStack_35e70.fPivot.fExtAlloc;
      TStack_35e70.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498
      ;
      TStack_35e70.fPivot.super_TPZVec<int>.fNElements = 0;
      TStack_35e70.fPivot.super_TPZVec<int>.fNAlloc = 0;
      TStack_35e70.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      TStack_35e70.fWork.fStore = (double *)0x0;
      TStack_35e70.fWork.fNElements = 0;
      TStack_35e70.fWork.fNAlloc = 0;
      uVar15 = lVar14 * lVar4;
      if (uVar15 == 0) {
        TStack_35e70.fElem = (double *)0x0;
      }
      else if (3 < (long)uVar15) {
        TStack_35e70.fElem = (double *)operator_new__(-(ulong)(uVar15 >> 0x3d != 0) | uVar15 * 8);
      }
      TStack_35e70.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_018451b8;
      pTVar7 = TPZCompEl::Reference((TPZCompEl *)this);
      iVar2 = (**(code **)(*(long *)pTVar7 + 0x210))(pTVar7);
      TPZManVector<double,_10>::TPZManVector(&TStack_35dc0,(long)iVar2);
      TPZManVector<double,_10>::TPZManVector(&TStack_35ee0,lStack_35f70);
      TPZVec<double>::Fill(&TStack_35ee0.super_TPZVec<double>,(double *)&TStack_349e0,0,-1);
      TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5>::TPZManVector(&TStack_349e0,0);
      uVar15 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
      (*_DAT_00000018)(&TStack_349e0,uVar15);
      (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x290))
                (this,&TStack_349e0,0);
      if (0 < (long)uVar15) {
        pbVar8 = &((TStack_349e0.super_TPZVec<TPZMaterialDataT<std::complex<double>_>_>.fStore)->
                  super_TPZMaterialData).fNeedsSol;
        uVar13 = 0;
        uVar12 = 0xffffffff;
        do {
          if (*(MShapeFunctionType *)(pbVar8 + -0x38f0) != EEmpty) {
            *pbVar8 = true;
            uVar12 = uVar13;
          }
          uVar13 = (ulong)((int)uVar13 + 1);
          pbVar8 = pbVar8 + 0xa850;
        } while (uVar13 < uVar15);
        if ((int)uVar12 != -1) {
          TPZManVector<TPZTransform<double>,_10>::TPZManVector(&TStack_35a40,0);
          (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
                    (this);
          uStack_35f74 = (*(TStack_35f88.fRef)->fPointer->_vptr_TPZIntPoints[3])();
          TStack_35b90.fElem = adStack_35b00;
          TStack_35b90.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
          TStack_35b90.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
          TStack_35b90.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          TStack_35b90.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          TStack_35b90.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
               = (_func_int **)&PTR__TPZFMatrix_01816238;
          TStack_35b90.fSize = 9;
          pTStack_35f68 = errors;
          TStack_35b90.fGiven = TStack_35b90.fElem;
          TPZVec<int>::TPZVec(&TStack_35b90.fPivot.super_TPZVec<int>,0);
          TStack_35b90.fPivot.super_TPZVec<int>.fStore = TStack_35b90.fPivot.fExtAlloc;
          TStack_35b90.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          TStack_35b90.fPivot.super_TPZVec<int>.fNElements = 0;
          TStack_35b90.fPivot.super_TPZVec<int>.fNAlloc = 0;
          TStack_35b90.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          TStack_35b90.fWork.fStore = (double *)0x0;
          TStack_35b90.fWork.fNElements = 0;
          TStack_35b90.fWork.fNAlloc = 0;
          TStack_35b90.fElem = (double *)0x0;
          TStack_35b90.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
               = (_func_int **)&PTR__TPZFNMatrix_01815f48;
          TStack_35c70.fElem = adStack_35be0;
          TStack_35c70.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
          TStack_35c70.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
          TStack_35c70.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          TStack_35c70.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          TStack_35c70.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
               = (_func_int **)&PTR__TPZFMatrix_01816238;
          TStack_35c70.fSize = 9;
          TStack_35c70.fGiven = TStack_35c70.fElem;
          TPZVec<int>::TPZVec(&TStack_35c70.fPivot.super_TPZVec<int>,0);
          TStack_35c70.fPivot.super_TPZVec<int>.fStore = TStack_35c70.fPivot.fExtAlloc;
          TStack_35c70.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          TStack_35c70.fPivot.super_TPZVec<int>.fNElements = 0;
          TStack_35c70.fPivot.super_TPZVec<int>.fNAlloc = 0;
          TStack_35c70.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          TStack_35c70.fWork.fStore = (double *)0x0;
          TStack_35c70.fWork.fNElements = 0;
          TStack_35c70.fWork.fNAlloc = 0;
          TStack_35c70.fElem = (double *)0x0;
          TStack_35c70.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
               = (_func_int **)&PTR__TPZFNMatrix_01815f48;
          TStack_35d50.fElem = adStack_35cc0;
          TStack_35d50.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
          TStack_35d50.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
          TStack_35d50.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          TStack_35d50.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          TStack_35d50.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
               = (_func_int **)&PTR__TPZFMatrix_01816238;
          TStack_35d50.fSize = 9;
          TStack_35d50.fGiven = TStack_35d50.fElem;
          TPZVec<int>::TPZVec(&TStack_35d50.fPivot.super_TPZVec<int>,0);
          TStack_35d50.fPivot.super_TPZVec<int>.fStore = TStack_35d50.fPivot.fExtAlloc;
          TStack_35d50.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          TStack_35d50.fPivot.super_TPZVec<int>.fNElements = 0;
          TStack_35d50.fPivot.super_TPZVec<int>.fNAlloc = 0;
          TStack_35d50.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          TStack_35d50.fWork.fStore = (double *)0x0;
          TStack_35d50.fWork.fNElements = 0;
          TStack_35d50.fWork.fNAlloc = 0;
          TStack_35d50.fElem = (double *)0x0;
          TStack_35d50.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
               = (_func_int **)&PTR__TPZFNMatrix_01815f48;
          pTVar7 = TPZCompEl::Reference((TPZCompEl *)this);
          if (0 < (int)uStack_35f74) {
            uVar15 = (ulong)dStack_35f80 & 0xffffffff;
            uVar12 = 0;
            do {
              (*(TStack_35f88.fRef)->fPointer->_vptr_TPZIntPoints[4])
                        ((TStack_35f88.fRef)->fPointer,uVar12,&TStack_35dc0,&dStack_35f60);
              TPZGeoEl::Jacobian(pTVar7,&TStack_35dc0.super_TPZVec<double>,&TStack_35b90,
                                 &TStack_35c70,&dStack_35f48,&TStack_35d50);
              (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x2b0))
                        (this,&TStack_35dc0,&TStack_35a40,&TStack_349e0);
              dStack_35f60 = ABS(dStack_35f48) * dStack_35f60;
              (**(code **)*plStack_35f50)(plStack_35f50,&TStack_349e0,&TStack_35ee0);
              if (0 < dStack_35f80._0_4_) {
                pdVar9 = pTStack_35f68->fStore;
                uVar13 = 0;
                do {
                  pdVar9[uVar13] =
                       TStack_35ee0.super_TPZVec<double>.fStore[uVar13] * dStack_35f60 +
                       pdVar9[uVar13];
                  uVar13 = uVar13 + 1;
                } while (uVar15 != uVar13);
              }
              uVar18 = (int)uVar12 + 1;
              uVar12 = (ulong)uVar18;
            } while (uVar18 != uStack_35f74);
          }
          pTVar1 = pTStack_35f68;
          lVar4 = lStack_35f70;
          if (0 < dStack_35f80._0_4_) {
            pdVar9 = pTStack_35f68->fStore;
            lVar14 = 0;
            do {
              dVar19 = pdVar9[lVar14];
              if (dVar19 < 0.0) {
                dVar19 = sqrt(dVar19);
              }
              else {
                dVar19 = SQRT(dVar19);
              }
              pdVar9 = pTVar1->fStore;
              pdVar9[lVar14] = dVar19;
              lVar14 = lVar14 + 1;
            } while (lVar4 != lVar14);
          }
          if ((char)uStack_35f54 != '\0') {
            lVar4 = (this->super_TPZMultiphysicsElement).super_TPZCompEl.fIndex;
            pTVar10 = TPZCompEl::Mesh((TPZCompEl *)this);
            pTVar11 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar10->fElementSolution);
            if ((pTVar11->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < lStack_35f70) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "The element solution of the mesh should be resized before EvaluateError\n"
                         ,0x48);
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                         ,0x4f0);
            }
            if (0 < dStack_35f80._0_4_) {
              lVar14 = (pTVar11->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
              lVar16 = 0;
              do {
                dStack_35f80 = pTStack_35f68->fStore[lVar16];
                if (((lVar4 < 0) || (lVar14 <= lVar4)) ||
                   ((pTVar11->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar16)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pTVar11->fElem[lVar14 * lVar16 + lVar4] = dStack_35f80;
                lVar16 = lVar16 + 1;
              } while (lStack_35f70 != lVar16);
            }
          }
          (*(TStack_35f88.fRef)->fPointer->_vptr_TPZIntPoints[5])
                    ((TStack_35f88.fRef)->fPointer,&TStack_35f40,0);
          TPZFMatrix<double>::~TPZFMatrix(&TStack_35d50,&PTR_PTR_01816200);
          TPZFMatrix<double>::~TPZFMatrix(&TStack_35c70,&PTR_PTR_01816200);
          TPZFMatrix<double>::~TPZFMatrix(&TStack_35b90,&PTR_PTR_01816200);
          TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&TStack_35a40);
          TPZManVector<TPZMaterialDataT<std::complex<double>_>,_5>::~TPZManVector(&TStack_349e0);
          TPZManVector<double,_10>::~TPZManVector(&TStack_35ee0);
          TPZManVector<double,_10>::~TPZManVector(&TStack_35dc0);
          TPZFMatrix<double>::~TPZFMatrix(&TStack_35e70,&PTR_PTR_01845470);
          TPZManVector<double,_10>::~TPZManVector(&TStack_35ab0);
          if (TStack_35f10.super_TPZVec<int>.fStore != TStack_35f10.fExtAlloc) {
            TStack_35f10.super_TPZVec<int>.fNAlloc = 0;
            TStack_35f10.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
            if (TStack_35f10.super_TPZVec<int>.fStore != (int *)0x0) {
              operator_delete__(TStack_35f10.super_TPZVec<int>.fStore);
            }
          }
          if (TStack_35f40.super_TPZVec<int>.fStore != TStack_35f40.fExtAlloc) {
            TStack_35f40.super_TPZVec<int>.fNAlloc = 0;
            TStack_35f40.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
            if (TStack_35f40.super_TPZVec<int>.fStore != (int *)0x0) {
              operator_delete__(TStack_35f40.super_TPZVec<int>.fStore);
            }
          }
          TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&TStack_35f88);
          return;
        }
      }
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                 ,0x4cd);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "void TPZMultiphysicsCompEl<pzgeom::TPZGeoTetrahedra>::EvaluateErrorT(TPZVec<REAL> &, bool) [TGeometry = pzgeom::TPZGeoTetrahedra, TVar = std::complex<double>]"
               ,0x9e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," no error interface for this element.\n",0x26);
    pcVar17 = "See TPZMatErrorCombinedSpaces\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,0x1e);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::EvaluateErrorT(TPZVec<REAL> &errors, bool store_errors) {
  errors.Fill(0.);
  auto *nullmat = dynamic_cast<TPZNullMaterialCS<TVar> *>(this->Material());
    if(nullmat) return;
  auto *mat =
      dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(this->Material());
  auto *matError =
      dynamic_cast<TPZMatErrorCombinedSpaces<TVar>*>(mat);
  
  //TPZMaterial * matptr = material.operator->();
  if (!mat) {
      PZError << __PRETTY_FUNCTION__;
      PZError<<" no material for this element\n";
      return;
  }
  if(!matError){
      PZError << __PRETTY_FUNCTION__;
      PZError<<" no error interface for this element.\n";
      PZError<<"See TPZMatErrorCombinedSpaces\n";
      return;
  }
      
  const int NErrors = matError->NEvalErrors();
  errors.Resize(NErrors);
  errors.Fill(0.);

  // Return if BC
  if (this->NConnects() == 0) return;

  // Adjust the order of the integration rule
  int dim = Dimension();
  TPZAutoPointer<TPZIntPoints> intrule = this->GetIntegrationRule().Clone();
  int maxIntOrder = intrule->GetMaxOrder();
  TPZManVector<int, 3> prevorder(dim), maxorder(dim, maxIntOrder);
  intrule->GetOrder(prevorder);
  const int order_limit = 15;
  if (maxIntOrder > order_limit) {
    if (prevorder[0] > order_limit) {
      maxIntOrder = prevorder[0];
    } else {
      maxIntOrder = order_limit;
    }
  }

  intrule->SetOrder(maxorder);

  const int ndof = this->Material()->NStateVariables();
  TPZManVector<STATE, 10> u_exact(ndof);
  TPZFNMatrix<3, STATE> du_exact(dim, ndof);
  TPZManVector<REAL, 10> intpoint(Reference()->Dimension()), values(NErrors);
  values.Fill(0.0);
  REAL weight;

  TPZManVector<TPZMaterialDataT<TVar>, 5> datavec;
  const int64_t nref = fElementVec.size();
  datavec.resize(nref);
  InitMaterialData(datavec);
  int iactive = -1;
  for (unsigned int i = 0; i < nref; ++i) {
    if (datavec[i].fShapeType != TPZMaterialData::EEmpty) {
      datavec[i].fNeedsSol = true;
      iactive = i;
    }
  }

  if (iactive == -1) DebugStop();

  TPZManVector<TPZTransform<> > trvec;
  AffineTransform(trvec);

  int nintpoints = intrule->NPoints();
  TPZFNMatrix<9, REAL> jac, axe, jacInv;
  REAL detJac;
  TPZGeoEl *ref = this->Reference();

  for (int nint = 0; nint < nintpoints; nint++) {

    intrule->Point(nint, intpoint, weight);

    ref->Jacobian(intpoint, jac, axe, detJac, jacInv);
    this->ComputeRequiredData(intpoint, trvec, datavec);

    weight *= fabs(detJac);
    matError->Errors(datavec, values);

    for (int ier = 0; ier < NErrors; ier++) {
      errors[ier] += values[ier] * weight;
    }

  }//fim for : integration rule
  //Norma sobre o elemento
  for (int ier = 0; ier < NErrors; ier++) {
    errors[ier] = sqrt(errors[ier]);
  }//for ier

  if (store_errors) {
    int64_t index = Index();
    TPZFMatrix<STATE> &elvals = Mesh()->ElementSolution();
    if (elvals.Cols() < NErrors) {
      std::cout << "The element solution of the mesh should be resized before EvaluateError\n";
      DebugStop();
    }
    for (int ier = 0; ier < NErrors; ier++) {
      elvals(index, ier) = errors[ier];
    }
  }
  intrule->SetOrder(prevorder);
}